

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_timer.h
# Opt level: O2

int64_t aom_usec_timer_elapsed(aom_usec_timer *t)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (t->end).tv_usec - (t->begin).tv_usec;
  lVar2 = lVar1 + 1000000;
  if (-1 < lVar1) {
    lVar2 = lVar1;
  }
  return ((lVar1 >> 0x3f) + ((t->end).tv_sec - (t->begin).tv_sec)) * 1000000 + lVar2;
}

Assistant:

static inline int64_t aom_usec_timer_elapsed(struct aom_usec_timer *t) {
#if defined(_WIN32)
  LARGE_INTEGER freq, diff;

  diff.QuadPart = t->end.QuadPart - t->begin.QuadPart;

  QueryPerformanceFrequency(&freq);
  return diff.QuadPart * 1000000 / freq.QuadPart;
#else
  struct timeval diff;

  timersub(&t->end, &t->begin, &diff);
  return ((int64_t)diff.tv_sec) * 1000000 + diff.tv_usec;
#endif
}